

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

void __thiscall antlr::ASTFactory::~ASTFactory(ASTFactory *this)

{
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *ppVar1;
  pointer pppVar2;
  
  this->_vptr_ASTFactory = (_func_int **)&PTR__ASTFactory_002fd0a0;
  pppVar2 = (this->nodeFactories).
            super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pppVar2 !=
      (this->nodeFactories).
      super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ppVar1 = *pppVar2;
      if (ppVar1 != (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)0x0 &&
          ppVar1 != &this->default_factory_descriptor) {
        operator_delete(ppVar1,0x10);
      }
      pppVar2 = pppVar2 + 1;
    } while (pppVar2 !=
             (this->nodeFactories).
             super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pppVar2 = (this->nodeFactories).
            super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pppVar2 != (pointer)0x0) {
    operator_delete(pppVar2,(long)(this->nodeFactories).
                                  super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pppVar2
                   );
    return;
  }
  return;
}

Assistant:

ASTFactory::~ASTFactory()
{
	factory_descriptor_list::iterator i = nodeFactories.begin();

	while( i != nodeFactories.end() )
	{
		if( *i != &default_factory_descriptor )
			delete *i;
		++i;
	}
}